

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

tchar_t * NodeStr2(anynode *AnyNode,fourcc_t ClassId,int No)

{
  anynode *Any;
  nodeclass *Class;
  tchar_t *ptVar1;
  
  if (AnyNode == (anynode *)0x0) {
    __assert_fail("(const void*)(AnyNode)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x65b,"const tchar_t *NodeStr2(anynode *, fourcc_t, int)");
  }
  Any = (anynode *)**(undefined8 **)((long)AnyNode + 8);
  Class = NodeContext_FindClass(Any,ClassId);
  if (Class != (nodeclass *)0x0) {
    ptVar1 = NodeClass_Str(AnyNode,Class,No);
    return ptVar1;
  }
  if (*(code **)((long)Any + 0xa0) != (code *)0x0) {
    ptVar1 = (tchar_t *)(**(code **)((long)Any + 0xa0))(Any,ClassId,No);
    return ptVar1;
  }
  return "";
}

Assistant:

const tchar_t* NodeStr2(anynode* AnyNode,fourcc_t ClassId,int No)
{
    nodecontext* Context = Node_Context(AnyNode);
    const nodeclass* Class = NodeContext_FindClass(Context,ClassId);
    if (Class)
        return NodeClass_Str(AnyNode,Class,No);
    if (Context->ExternalStr)
        return Context->ExternalStr(Context,ClassId,No);
    return T("");
}